

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_server.cpp
# Opt level: O0

void __thiscall
miniros::ServiceServer::ServiceServer(ServiceServer *this,string *service,NodeHandle *node_handle)

{
  element_type *this_00;
  string *in_RSI;
  shared_ptr<miniros::NodeHandle> *in_RDI;
  shared_ptr<miniros::NodeHandle> *in_stack_ffffffffffffffa8;
  NodeHandle *in_stack_ffffffffffffffd8;
  
  std::make_shared<miniros::ServiceServer::Impl>();
  this_00 = std::
            __shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4b3b9e);
  std::__cxx11::string::operator=((string *)this_00,in_RSI);
  std::make_shared<miniros::NodeHandle,miniros::NodeHandle_const&>(in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4b3bc8);
  std::shared_ptr<miniros::NodeHandle>::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<miniros::NodeHandle>::~shared_ptr((shared_ptr<miniros::NodeHandle> *)0x4b3be3);
  return;
}

Assistant:

ServiceServer::ServiceServer(const std::string& service, const NodeHandle& node_handle)
: impl_(std::make_shared<Impl>())
{
  impl_->service_ = service;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
}